

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_sptfqmr_serial.c
# Opt level: O0

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  double local_60;
  uint local_54;
  double local_50;
  realtype maxerr;
  realtype *Ydata;
  realtype *Xdata;
  sunindextype i;
  int failure;
  realtype tol_local;
  N_Vector Y_local;
  N_Vector X_local;
  
  i._4_4_ = 0;
  prVar1 = N_VGetArrayPointer(X);
  prVar2 = N_VGetArrayPointer(Y);
  for (Xdata = (realtype *)0x0; (long)Xdata < problem_size; Xdata = (realtype *)((long)Xdata + 1)) {
    if (NAN(prVar1[(long)Xdata])) {
      local_54 = 1;
    }
    else {
      local_54 = (uint)(tol * 5.0 * ABS(prVar1[(long)Xdata]) <
                       ABS(prVar1[(long)Xdata] - prVar2[(long)Xdata]));
    }
    i._4_4_ = local_54 + i._4_4_;
  }
  if ((double)i._4_4_ <= 0.0) {
    X_local._4_4_ = 0;
  }
  else {
    local_50 = 0.0;
    for (Xdata = (realtype *)0x0; (long)Xdata < problem_size; Xdata = (realtype *)((long)Xdata + 1))
    {
      if (ABS(prVar1[(long)Xdata] - prVar2[(long)Xdata]) / ABS(prVar1[(long)Xdata]) <= local_50) {
        local_60 = local_50;
      }
      else {
        local_60 = ABS(prVar1[(long)Xdata] - prVar2[(long)Xdata]) / ABS(prVar1[(long)Xdata]);
      }
      local_50 = local_60;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",local_50,tol * 5.0);
    X_local._4_4_ = 1;
  }
  return X_local._4_4_;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  
  /* check vector data */
  for(i=0; i<problem_size; i++)
    failure += FNEQ(Xdata[i], Ydata[i], FIVE*tol*SUNRabs(Xdata[i]));

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < problem_size; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i])/SUNRabs(Xdata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, FIVE*tol);
    return(1);
  }
  else
    return(0);
}